

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *
server_task::get_list_id
          (unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>
           *__return_storage_ptr__,vector<server_task,_std::allocator<server_task>_> *tasks)

{
  __hashtable *__h;
  ulong uVar1;
  pointer psVar2;
  long lVar3;
  allocator_type local_3b;
  key_equal local_3a;
  hash<int> local_39;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *local_38;
  
  httplib::detail::std::
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::_Hashtable(&__return_storage_ptr__->_M_h,
               ((long)(tasks->super__Vector_base<server_task,_std::allocator<server_task>_>)._M_impl
                      .super__Vector_impl_data._M_finish -
                (long)(tasks->super__Vector_base<server_task,_std::allocator<server_task>_>)._M_impl
                      .super__Vector_impl_data._M_start >> 3) * 0x76bd8c8714b2a7c3,&local_39,
               &local_3a,&local_3b);
  psVar2 = (tasks->super__Vector_base<server_task,_std::allocator<server_task>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((tasks->super__Vector_base<server_task,_std::allocator<server_task>_>)._M_impl.
      super__Vector_impl_data._M_finish != psVar2) {
    lVar3 = 0;
    uVar1 = 0;
    do {
      local_38 = __return_storage_ptr__;
      std::
      _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<int,false>>>>
                ((_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)__return_storage_ptr__,(long)&psVar2->id + lVar3,&local_38);
      uVar1 = uVar1 + 1;
      psVar2 = (tasks->super__Vector_base<server_task,_std::allocator<server_task>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x758;
    } while (uVar1 < (ulong)(((long)(tasks->
                                    super__Vector_base<server_task,_std::allocator<server_task>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)psVar2 >> 3) *
                            0x76bd8c8714b2a7c3));
  }
  return __return_storage_ptr__;
}

Assistant:

static std::unordered_set<int> get_list_id(const std::vector<server_task> & tasks) {
        std::unordered_set<int> ids(tasks.size());
        for (size_t i = 0; i < tasks.size(); i++) {
            ids.insert(tasks[i].id);
        }
        return ids;
    }